

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O3

void __thiscall
DynamicGraph::dropLevel
          (DynamicGraph *this,Vertex w,list<unsigned_long,_std::allocator<unsigned_long>_> *queue,
          list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
          *actions,list<unsigned_long,_std::allocator<unsigned_long>_> *incVertices)

{
  size_t *psVar1;
  _Rb_tree_node_base *p_Var2;
  pointer puVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *this_00;
  pointer pRVar8;
  pointer pRVar9;
  pair<std::_Rb_tree_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::_Rb_tree_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  pVar10;
  
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = (_List_node_base *)w;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(incVertices->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  puVar3 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + w;
  *puVar3 = *puVar3 + 1;
  pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var6 = *(_Base_ptr *)((long)&pRVar9[w].b_sibl._M_t._M_impl + 0x18);
  if (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].b_sibl._M_t._M_impl + 8U)) {
    do {
      p_Var2 = p_Var6 + 1;
      p_Var7 = p_Var6[1]._M_parent;
      if (p_Var7 == (_Base_ptr)w) {
        p_Var7 = *(_Base_ptr *)p_Var2;
      }
      p_Var4 = (_List_node_base *)operator_new(0x28);
      Delete::Delete((Delete *)p_Var4,&pRVar9[(long)p_Var7].b_sibl,*(Edge *)p_Var2);
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(actions->
                super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      this_00 = &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl
                 .super__Vector_impl_data._M_start[(long)p_Var7].b_sibl;
      pVar10 = std::
               _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
               ::equal_range(&this_00->_M_t,(key_type *)p_Var2);
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node
                    );
      p_Var4 = (_List_node_base *)operator_new(0x28);
      Insert::Insert((Insert *)p_Var4,
                     &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)p_Var7].c_succ,*(Edge *)p_Var2)
      ;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(actions->
                super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
      ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>const&>
                ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                  *)&(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)p_Var7].c_succ,
                 (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)p_Var2);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].b_sibl._M_t._M_impl + 8U));
  }
  pRVar8 = pRVar9 + w;
  p_Var6 = *(_Base_ptr *)((long)&pRVar9[w].a_pred._M_t._M_impl + 0x18);
  if (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].a_pred._M_t._M_impl + 8U)) {
    do {
      p_Var4 = (_List_node_base *)operator_new(0x28);
      Delete::Delete((Delete *)p_Var4,&pRVar8->a_pred,*(Edge *)(p_Var6 + 1));
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(actions->
                super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
               super__Vector_impl_data._M_start;
      pRVar8 = pRVar9 + w;
    } while (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].a_pred._M_t._M_impl + 8U));
  }
  std::
  _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::clear((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           *)pRVar8);
  pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var6 = *(_Base_ptr *)((long)&pRVar9[w].b_sibl._M_t._M_impl + 0x18);
  if (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].b_sibl._M_t._M_impl + 8U)) {
    do {
      p_Var4 = (_List_node_base *)operator_new(0x28);
      Insert::Insert((Insert *)p_Var4,&pRVar9[w].a_pred,*(Edge *)(p_Var6 + 1));
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(actions->
                super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
      ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>const&>
                ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                  *)((this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                     _M_impl.super__Vector_impl_data._M_start + w),
                 (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)(p_Var6 + 1));
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].b_sibl._M_t._M_impl + 8U));
  }
  p_Var6 = *(_Base_ptr *)((long)&pRVar9[w].c_succ._M_t._M_impl + 0x18);
  if (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].c_succ._M_t._M_impl + 8U)) {
    do {
      p_Var2 = p_Var6 + 1;
      p_Var7 = p_Var6[1]._M_parent;
      if (p_Var7 == (_Base_ptr)w) {
        p_Var7 = *(_Base_ptr *)p_Var2;
      }
      p_Var4 = (_List_node_base *)operator_new(0x28);
      Delete::Delete((Delete *)p_Var4,&pRVar9[(long)p_Var7].a_pred,*(Edge *)p_Var2);
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(actions->
                super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
               super__Vector_impl_data._M_start + (long)p_Var7;
      pVar10 = std::
               _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
               ::equal_range((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                              *)pRVar9,(key_type *)p_Var2);
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::_M_erase_aux((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                      *)pRVar9,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
      p_Var4 = (_List_node_base *)operator_new(0x28);
      Insert::Insert((Insert *)p_Var4,
                     &(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)p_Var7].b_sibl,*(Edge *)p_Var2)
      ;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(actions->
                super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
      ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>const&>
                ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                  *)&(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)p_Var7].b_sibl,
                 (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)p_Var2);
      pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(size_t *)((long)&pRVar9[(long)p_Var7].a_pred._M_t._M_impl + 0x28) == 0) {
        p_Var4 = (_List_node_base *)operator_new(0x18);
        p_Var4[1]._M_next = (_List_node_base *)p_Var7;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(queue->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl
                 .super__Vector_impl_data._M_start;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].c_succ._M_t._M_impl + 8U));
  }
  pRVar8 = pRVar9 + w;
  p_Var6 = *(_Base_ptr *)((long)&(pRVar8->b_sibl)._M_t._M_impl + 0x18);
  while (p_Var6 != (_Rb_tree_node_base *)((long)&(pRVar8->b_sibl)._M_t._M_impl + 8U)) {
    p_Var4 = (_List_node_base *)operator_new(0x28);
    Delete::Delete((Delete *)p_Var4,&pRVar9[w].b_sibl,*(Edge *)(p_Var6 + 1));
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = p_Var4;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(actions->
              super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar8 = pRVar9 + w;
  }
  std::
  _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::clear(&pRVar9[w].b_sibl._M_t);
  pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var6 = *(_Base_ptr *)((long)&pRVar9[w].c_succ._M_t._M_impl + 0x18);
  if (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].c_succ._M_t._M_impl + 8U)) {
    do {
      p_Var4 = (_List_node_base *)operator_new(0x28);
      Insert::Insert((Insert *)p_Var4,&pRVar9[w].b_sibl,*(Edge *)(p_Var6 + 1));
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(actions->
                super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
      ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>const&>
                ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                  *)&(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                     _M_impl.super__Vector_impl_data._M_start[w].b_sibl,
                 (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)(p_Var6 + 1));
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].c_succ._M_t._M_impl + 8U));
    p_Var6 = *(_Base_ptr *)((long)&pRVar9[w].c_succ._M_t._M_impl + 0x18);
  }
  while (p_Var6 != (_Rb_tree_node_base *)((long)&pRVar9[w].c_succ._M_t._M_impl + 8U)) {
    p_Var4 = (_List_node_base *)operator_new(0x28);
    Delete::Delete((Delete *)p_Var4,&pRVar9[w].c_succ,*(Edge *)(p_Var6 + 1));
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = p_Var4;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(actions->
              super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    pRVar9 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  std::
  _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::clear(&pRVar9[w].c_succ._M_t);
  if (*(size_t *)
       ((long)&(this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
               super__Vector_impl_data._M_start[w].a_pred._M_t._M_impl + 0x28) == 0) {
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = (_List_node_base *)w;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(queue->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void DynamicGraph::dropLevel(Vertex w, std::list<Vertex> &queue,
                             std::list<std::unique_ptr<Action>> &actions, std::list<Vertex> &incVertices)
{
    // Remove w from its level (say, Lj), and put it in the next level (Lj+1)
    incVertices.push_front(w);
    level[w]++;

    // For each edge e (w---w') in b_sibl(w)
    for(auto ei = relatives[w].b_sibl.begin(); ei != relatives[w].b_sibl.end(); ++ei) {
        Vertex ww = (w==target(*ei, *this)) ? source(*ei, *this) : target(*ei, *this);
        // remove e from b_sibl(w')
        actions.emplace_front(new Delete(relatives[ww].b_sibl, *ei));
        relatives[ww].b_sibl.erase(*ei);
        // and put it in c_succ(w')
        actions.emplace_front(new Insert(relatives[ww].c_succ, *ei));
        relatives[ww].c_succ.insert(*ei);
    }

    // a_pred(w) <- b_pred(w)
    for(auto ei = relatives[w].a_pred.begin(); ei != relatives[w].a_pred.end(); ++ei) {
        actions.emplace_front(new Delete(relatives[w].a_pred, *ei));
    }
    relatives[w].a_pred.clear();
    for(auto ei = relatives[w].b_sibl.begin(); ei != relatives[w].b_sibl.end(); ++ei) {
        actions.emplace_front(new Insert(relatives[w].a_pred, *ei));
        relatives[w].a_pred.insert(*ei);
    }

    // For each edge e (w---w') in c_succ(w)
    for(auto ei = relatives[w].c_succ.begin(); ei != relatives[w].c_succ.end(); ++ei) {
        Vertex ww = (w==target(*ei, *this)) ? source(*ei, *this) : target(*ei, *this);
        // remove e from a_pred(w')
        actions.emplace_front(new Delete(relatives[ww].a_pred, *ei));
        relatives[ww].a_pred.erase(*ei);
        // and put it in b_sibl(w');
        actions.emplace_front(new Insert(relatives[ww].b_sibl, *ei));
        relatives[ww].b_sibl.insert(*ei);
        // if the new a_pred(w') is empty, put w' on Q.
        if(relatives[ww].a_pred.empty()) {
            queue.push_back(ww);
        }
    }

    // b_sibl(w) <- c_succ(w)
    for(auto ei = relatives[w].b_sibl.begin(); ei != relatives[w].b_sibl.end(); ++ei) {
        actions.emplace_front(new Delete(relatives[w].b_sibl, *ei));
    }
    relatives[w].b_sibl.clear();
    for(auto ei = relatives[w].c_succ.begin(); ei != relatives[w].c_succ.end(); ++ei) {
        actions.emplace_front(new Insert(relatives[w].b_sibl, *ei));
        relatives[w].b_sibl.insert(*ei);
    }

    // c_succ(w) <- {empty}
    for(auto ei = relatives[w].c_succ.begin(); ei != relatives[w].c_succ.end(); ++ei) {
        actions.emplace_front(new Delete(relatives[w].c_succ, *ei));
    }
    relatives[w].c_succ.clear();

    // If a_pred(w) is empty, put w on Q.
    if(relatives[w].a_pred.empty()) {
        queue.push_back(w);
    }
}